

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSEQDecStart(der_anchor_t *anchor,octet *der,size_t count,u32 tag)

{
  bool_t bVar1;
  size_t sVar2;
  int in_ECX;
  size_t in_RDX;
  octet *in_RSI;
  undefined8 *in_RDI;
  size_t l_count;
  size_t t_count;
  size_t local_8;
  
  bVar1 = derTIsConstructive(0);
  if (bVar1 == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    *in_RDI = in_RSI;
    local_8 = derTDec((u32 *)(in_RDI + 2),in_RSI,in_RDX);
    if ((local_8 == 0xffffffffffffffff) || (*(int *)(in_RDI + 2) != in_ECX)) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      sVar2 = derLDec(in_RDI + 3,in_RSI + local_8,in_RDX - local_8);
      if (sVar2 == 0xffffffffffffffff) {
        local_8 = 0xffffffffffffffff;
      }
      else {
        local_8 = local_8 + sVar2;
      }
    }
  }
  return local_8;
}

Assistant:

size_t derTSEQDecStart(der_anchor_t* anchor, const octet der[], size_t count,
	u32 tag)
{
	size_t t_count;
	size_t l_count;
	// pre
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// проверить тег
	if (!derTIsConstructive(tag))
		return SIZE_MAX;
	// бросить якорь
	anchor->der = der;
	// декодировать тег
	t_count = derTDec(&anchor->tag, der, count);
	if (t_count == SIZE_MAX || anchor->tag != tag)
		return SIZE_MAX;
	// декодировать длину
	l_count = derLDec(&anchor->len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	return t_count + l_count;
}